

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_network.cpp
# Opt level: O0

void __thiscall
NeuralNetwork::NeuralNetwork
          (NeuralNetwork *this,vector<int,_std::allocator<int>_> *shape,float learningRate,
          int batch_size,int epoch,activate_func_t activateFunc,
          derive_activate_func_t deriveActivateFunc)

{
  size_type sVar1;
  const_reference pvVar2;
  int in_ECX;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  int *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  int in_XMM0_Da;
  int i;
  Layer *in_stack_000012c0;
  value_type *in_stack_fffffffffffffe98;
  Layer *in_stack_fffffffffffffea0;
  Layer *this_00;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  Layer *in_stack_ffffffffffffff60;
  int local_34;
  
  sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  *in_RDI = (int)sVar1;
  in_RDI[1] = in_XMM0_Da;
  *(undefined8 *)(in_RDI + 2) = in_R8;
  *(undefined8 *)(in_RDI + 4) = in_R9;
  pvVar2 = std::vector<int,_std::allocator<int>_>::front
                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea0);
  in_RDI[6] = *pvVar2;
  pvVar2 = std::vector<int,_std::allocator<int>_>::back
                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea0);
  in_RDI[7] = *pvVar2;
  in_RDI[8] = in_EDX;
  in_RDI[9] = in_ECX;
  std::vector<Layer,_std::allocator<Layer>_>::vector
            ((vector<Layer,_std::allocator<Layer>_> *)0x1458bb);
  for (local_34 = 0; local_34 < *in_RDI + -1; local_34 = local_34 + 1) {
    std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_34);
    std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)(local_34 + 1));
    Layer::Layer(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
    std::vector<Layer,_std::allocator<Layer>_>::push_back
              ((vector<Layer,_std::allocator<Layer>_> *)in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98);
    Layer::~Layer(in_stack_fffffffffffffea0);
    std::vector<Layer,_std::allocator<Layer>_>::back
              ((vector<Layer,_std::allocator<Layer>_> *)in_stack_fffffffffffffea0);
    Layer::randomInit(in_stack_000012c0);
  }
  this_00 = (Layer *)(in_RDI + 10);
  std::vector<int,_std::allocator<int>_>::back((vector<int,_std::allocator<int>_> *)this_00);
  Layer::Layer(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  std::vector<Layer,_std::allocator<Layer>_>::push_back
            ((vector<Layer,_std::allocator<Layer>_> *)this_00,in_stack_fffffffffffffe98);
  Layer::~Layer(this_00);
  return;
}

Assistant:

NeuralNetwork::NeuralNetwork(const std::vector<int>& shape, float learningRate, int batch_size,
                             int epoch, activate_func_t activateFunc,
                             derive_activate_func_t deriveActivateFunc)
    : layerCount_(shape.size()), learningRate_(learningRate), activateFunc_(activateFunc),
      deriveActivateFunc_(deriveActivateFunc), inputSize_(shape.front()), outputSize_(shape.back()),
      batchSize_(batch_size), epoch_(epoch) {
    for (int i = 0; i < layerCount_ - 1; ++i) {
        layers_.push_back(Layer(shape[i], shape[i + 1]));
        layers_.back().randomInit();
    }
    layers_.push_back(Layer(shape.back(), 1));
}